

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Events.c
# Opt level: O0

void event_wake_up(tgestate_t *state)

{
  tgestate_t *in_RDI;
  tgestate_t *in_stack_00000010;
  
  in_RDI->bell = '(';
  queue_message(in_RDI,message_TIME_TO_WAKE_UP);
  wake_up(in_stack_00000010);
  return;
}

Assistant:

static void event_wake_up(tgestate_t *state)
{
  assert(state != NULL);

  state->bell = bell_RING_40_TIMES;
  queue_message(state, message_TIME_TO_WAKE_UP);
  wake_up(state);
}